

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JESPtype.cpp
# Opt level: O2

string * __thiscall
JESPtype::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,JESPtype *this,JESP_t type)

{
  E *this_00;
  undefined4 in_register_00000014;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_12;
  allocator<char> local_11;
  
  if ((int)this == 1) {
    __s = "JESPDP";
    __a = &local_12;
  }
  else {
    if ((int)this != 0) {
      this_00 = (E *)__cxa_allocate_exception(0x28,this,CONCAT44(in_register_00000014,type));
      E::E(this_00,"JESPtype::SoftPrint invalid type");
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    __s = "JESPExh";
    __a = &local_11;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string JESPtype::SoftPrint(JESP_t type)
{
    switch(type)
    {
    case JESPExhaustive:
        return("JESPExh");
        break;
    case JESPDP:
        return("JESPDP");
        break;
    }

    throw(E("JESPtype::SoftPrint invalid type"));

    return("INVALID_JESP_TYPE");
}